

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarseparator.cpp
# Opt level: O0

QSize __thiscall QToolBarSeparator::sizeHint(QToolBarSeparator *this)

{
  QStyle *pQVar1;
  QWidget *pQVar2;
  QStyleOption *in_RDI;
  long in_FS_OFFSET;
  int extent;
  QStyleOption opt;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined1 **ppuVar3;
  QStyleOption *in_stack_ffffffffffffff98;
  QSize local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  ppuVar3 = &local_48;
  QStyleOption::QStyleOption(in_stack_ffffffffffffff98,(int)((ulong)ppuVar3 >> 0x20),(int)ppuVar3);
  initStyleOption((QToolBarSeparator *)in_RDI,
                  (QStyleOption *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  pQVar1 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  pQVar2 = QWidget::parentWidget((QWidget *)0x701d24);
  (**(code **)(*(long *)pQVar1 + 0xe0))(pQVar1,0x38,ppuVar3,pQVar2);
  QSize::QSize((QSize *)in_RDI,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  QStyleOption::~QStyleOption(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_50;
  }
  __stack_chk_fail();
}

Assistant:

QSize QToolBarSeparator::sizeHint() const
{
    QStyleOption opt;
    initStyleOption(&opt);
    const int extent = style()->pixelMetric(QStyle::PM_ToolBarSeparatorExtent, &opt, parentWidget());
    return QSize(extent, extent);
}